

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

IRRef reassoc_trycse(jit_State *J,IROp op,IRRef op1,IRRef op2)

{
  IRIns *pIVar1;
  ushort uVar2;
  IRRef IVar3;
  IRRef1 *pIVar4;
  
  IVar3 = op1;
  if (op2 < op1) {
    IVar3 = op2;
  }
  pIVar4 = J->chain + op;
  if (op1 < op2) {
    op1 = op2;
  }
  while( true ) {
    uVar2 = *pIVar4;
    if (uVar2 <= op1) {
      return 0;
    }
    pIVar1 = (J->cur).ir + uVar2;
    if ((op1 == (pIVar1->field_0).op1) && (IVar3 == (pIVar1->field_0).op2)) break;
    pIVar4 = &(pIVar1->field_0).prev;
  }
  return (uint)uVar2;
}

Assistant:

static IRRef reassoc_trycse(jit_State *J, IROp op, IRRef op1, IRRef op2)
{
  IRRef ref = J->chain[op];
  IRRef lim = op1;
  if (op2 > lim) { lim = op2; op2 = op1; op1 = lim; }
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op1 == op1 && ir->op2 == op2)
      return ref;
    ref = ir->prev;
  }
  return 0;
}